

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectest-interp.cc
# Opt level: O0

Result __thiscall spectest::JSONParser::ParseString(JSONParser *this,string *out_string)

{
  int iVar1;
  short local_30;
  int local_2c;
  int cval;
  int i;
  uint16_t code;
  int c;
  string *out_string_local;
  JSONParser *this_local;
  
  std::__cxx11::string::clear();
  SkipWhitespace(this);
  iVar1 = ReadChar(this);
  if (iVar1 == 0x22) {
    while (iVar1 = ReadChar(this), iVar1 != 0x22) {
      if (iVar1 == 0x5c) {
        iVar1 = ReadChar(this);
        if (iVar1 != 0x75) {
          PrintError(this,"expected escape: \\uxxxx");
          wabt::Result::Result((Result *)((long)&this_local + 4),Error);
          return (Result)this_local._4_4_;
        }
        cval._2_2_ = 0;
        for (local_2c = 0; local_2c < 4; local_2c = local_2c + 1) {
          iVar1 = ReadChar(this);
          local_30 = (short)iVar1;
          if ((iVar1 < 0x30) || (0x39 < iVar1)) {
            if ((iVar1 < 0x61) || (0x66 < iVar1)) {
              if ((iVar1 < 0x41) || (0x46 < iVar1)) {
                PrintError(this,"expected hex char");
                wabt::Result::Result((Result *)((long)&this_local + 4),Error);
                return (Result)this_local._4_4_;
              }
              local_30 = local_30 + -0x37;
            }
            else {
              local_30 = local_30 + -0x57;
            }
          }
          else {
            local_30 = local_30 + -0x30;
          }
          cval._2_2_ = cval._2_2_ * 0x10 + local_30;
        }
        if (cval._2_2_ < 0x100) {
          std::__cxx11::string::operator+=((string *)out_string,(char)cval._2_2_);
        }
        else {
          PrintError(this,"only escape codes < 256 allowed, got %u\n",(ulong)cval._2_2_);
        }
      }
      else {
        std::__cxx11::string::operator+=((string *)out_string,(char)iVar1);
      }
    }
    wabt::Result::Result((Result *)((long)&this_local + 4),Ok);
  }
  else {
    PrintError(this,"expected string");
    wabt::Result::Result((Result *)((long)&this_local + 4),Error);
  }
  return (Result)this_local._4_4_;
}

Assistant:

wabt::Result JSONParser::ParseString(std::string* out_string) {
  out_string->clear();

  SkipWhitespace();
  if (ReadChar() != '"') {
    PrintError("expected string");
    return wabt::Result::Error;
  }

  while (1) {
    int c = ReadChar();
    if (c == '"') {
      break;
    } else if (c == '\\') {
      /* The only escape supported is \uxxxx. */
      c = ReadChar();
      if (c != 'u') {
        PrintError("expected escape: \\uxxxx");
        return wabt::Result::Error;
      }
      uint16_t code = 0;
      for (int i = 0; i < 4; ++i) {
        c = ReadChar();
        int cval;
        if (c >= '0' && c <= '9') {
          cval = c - '0';
        } else if (c >= 'a' && c <= 'f') {
          cval = c - 'a' + 10;
        } else if (c >= 'A' && c <= 'F') {
          cval = c - 'A' + 10;
        } else {
          PrintError("expected hex char");
          return wabt::Result::Error;
        }
        code = (code << 4) + cval;
      }

      if (code < 256) {
        *out_string += code;
      } else {
        PrintError("only escape codes < 256 allowed, got %u\n", code);
      }
    } else {
      *out_string += c;
    }
  }
  return wabt::Result::Ok;
}